

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.cpp
# Opt level: O0

void __thiscall Member::Member(Member *this,Member *anotherMember)

{
  Member *anotherMember_local;
  Member *this_local;
  
  this->_vptr_Member = (_func_int **)&PTR__Member_00114c90;
  Address::Address(&this->addr);
  std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::vector(&this->memberList);
  __gnu_cxx::
  __normal_iterator<MemberListEntry_*,_std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>_>
  ::__normal_iterator(&this->myPos);
  std::queue<q_elt,std::deque<q_elt,std::allocator<q_elt>>>::
  queue<std::deque<q_elt,std::allocator<q_elt>>,void>
            ((queue<q_elt,std::deque<q_elt,std::allocator<q_elt>>> *)&this->mp1q);
  Address::operator=(&this->addr,&anotherMember->addr);
  this->inited = (bool)(anotherMember->inited & 1);
  this->inGroup = (bool)(anotherMember->inGroup & 1);
  this->bFailed = (bool)(anotherMember->bFailed & 1);
  this->nnb = anotherMember->nnb;
  this->heartbeat = anotherMember->heartbeat;
  this->pingCounter = anotherMember->pingCounter;
  this->timeOutCounter = anotherMember->timeOutCounter;
  std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator=
            (&this->memberList,&anotherMember->memberList);
  (this->myPos)._M_current = (anotherMember->myPos)._M_current;
  std::queue<q_elt,_std::deque<q_elt,_std::allocator<q_elt>_>_>::operator=
            (&this->mp1q,&anotherMember->mp1q);
  return;
}

Assistant:

Member::Member(const Member &anotherMember) {
	this->addr = anotherMember.addr;
	this->inited = anotherMember.inited;
	this->inGroup = anotherMember.inGroup;
	this->bFailed = anotherMember.bFailed;
	this->nnb = anotherMember.nnb;
	this->heartbeat = anotherMember.heartbeat;
	this->pingCounter = anotherMember.pingCounter;
	this->timeOutCounter = anotherMember.timeOutCounter;
	this->memberList = anotherMember.memberList;
	this->myPos = anotherMember.myPos;
	this->mp1q = anotherMember.mp1q;
}